

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall NaStateSpaceModel::SetMatrices(NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB)

{
  int iVar1;
  int iVar2;
  uint nFbDepth_;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  long lVar6;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  NaMatrix *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = (**(code **)(*in_RSI + 0x38))();
  if (iVar1 != 0) {
    iVar1 = (**(code **)(*in_RSI + 0x30))();
    if (iVar1 != 0) {
      iVar1 = (**(code **)(*in_RDX + 0x38))();
      if (iVar1 != 0) {
        iVar1 = (**(code **)(*in_RDX + 0x30))();
        if (iVar1 != 0) {
          iVar1 = (**(code **)(*in_RSI + 0x30))();
          iVar2 = (**(code **)(*in_RSI + 0x38))();
          if (iVar1 == iVar2) {
            iVar1 = (**(code **)(*in_RSI + 0x30))();
            iVar2 = (**(code **)(*in_RDX + 0x30))();
            if (iVar1 == iVar2) {
              NaMatrix::operator=((NaMatrix *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffc8);
              NaMatrix::operator=((NaMatrix *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffc8);
              nFbDepth_ = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
              NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x50));
              NaMatrix::new_dim((NaMatrix *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                                (uint)in_stack_ffffffffffffffc8);
              NaMatrix::init_diag((NaMatrix *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  (NaReal)in_stack_ffffffffffffffc8);
              lVar6 = in_RDI + 0x98;
              uVar3 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
              NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
              NaMatrix::new_dim((NaMatrix *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                                (uint)((ulong)lVar6 >> 0x20),(uint)lVar6);
              NaMatrix::init_zero((NaMatrix *)0x17c4d5);
              uVar4 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
              *(uint *)(in_RDI + 0x40) = uVar4;
              uVar4 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
              *(uint *)(in_RDI + 0x44) = uVar4;
              uVar4 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
              *(uint *)(in_RDI + 0x48) = uVar4;
              NaUnit::Assign((NaUnit *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                             (uint)((ulong)lVar6 >> 0x20),(uint)lVar6,nFbDepth_);
              return;
            }
          }
        }
      }
    }
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 2;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C.new_dim(A.dim_rows(), A.dim_cols());
    C.init_diag(1.0);
    D.new_dim(C.dim_rows(), B.dim_cols());
    D.init_zero();

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}